

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::_cp
          (stack<c4::yml::Parser::State,_16UL> *this,stack<c4::yml::Parser::State,_16UL> *that)

{
  code *pcVar1;
  void *pvVar2;
  pfn_allocate p_Var3;
  pfn_error p_Var4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = that->m_capacity;
  if ((stack<c4::yml::Parser::State,_16UL> *)that->m_stack == that) {
    if (0x10 < uVar6) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: that->m_capacity <= N",0x23,
                 (anonymous_namespace)::s_default_callbacks);
      uVar6 = that->m_capacity;
    }
    if (that->m_size <= uVar6) goto LAB_001ed9da;
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
  }
  else {
    if (uVar6 < 0x11) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: that->m_capacity > N",0x22,
                 (anonymous_namespace)::s_default_callbacks);
      uVar6 = that->m_capacity;
    }
    if (that->m_size <= uVar6) goto LAB_001ed9da;
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
  }
  (*(code *)PTR_error_impl_002394c8)
            ("check failed: that->m_size <= that->m_capacity",0x2e,
             (anonymous_namespace)::s_default_callbacks);
LAB_001ed9da:
  memcpy(this->m_stack,that->m_stack,that->m_size * 0x98);
  uVar6 = that->m_size;
  this->m_size = uVar6;
  uVar7 = 0x10;
  if (0x10 < uVar6) {
    uVar7 = uVar6;
  }
  this->m_capacity = uVar7;
  pvVar2 = (that->m_callbacks).m_user_data;
  p_Var3 = (that->m_callbacks).m_allocate;
  p_Var4 = (that->m_callbacks).m_error;
  (this->m_callbacks).m_free = (that->m_callbacks).m_free;
  (this->m_callbacks).m_error = p_Var4;
  (this->m_callbacks).m_user_data = pvVar2;
  (this->m_callbacks).m_allocate = p_Var3;
  return;
}

Assistant:

void stack<T, N>::_cp(stack const* C4_RESTRICT that)
{
    if(that->m_stack != that->m_buf)
    {
        RYML_ASSERT(that->m_capacity > N);
        RYML_ASSERT(that->m_size <= that->m_capacity);
    }
    else
    {
        RYML_ASSERT(that->m_capacity <= N);
        RYML_ASSERT(that->m_size <= that->m_capacity);
    }
    memcpy(m_stack, that->m_stack, that->m_size * sizeof(T));
    m_size = that->m_size;
    m_capacity = that->m_size < N ? N : that->m_size;
    m_callbacks = that->m_callbacks;
}